

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeVSHLMaxInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  DecodeStatus DVar5;
  uint64_t in_RCX;
  undefined8 in_RDX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint Rd;
  uint size;
  uint Rm;
  DecodeStatus S;
  uint RegNo;
  undefined4 in_stack_ffffffffffffffe8;
  DecodeStatus local_4;
  
  RegNo = (uint)((ulong)in_RDX >> 0x20);
  local_4 = MCDisassembler_Success;
  fieldFromInstruction_4(in_ESI,0xc,4);
  fieldFromInstruction_4(in_ESI,0x16,1);
  uVar2 = fieldFromInstruction_4(in_ESI,0,4);
  uVar3 = fieldFromInstruction_4(in_ESI,5,1);
  uVar4 = uVar3 << 4 | uVar2;
  uVar2 = fieldFromInstruction_4(in_ESI,0x12,2);
  DVar5 = DecodeQPRRegisterClass
                    ((MCInst *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),RegNo,in_RCX,
                     (void *)CONCAT44(local_4,uVar4));
  _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar5);
  if (_Var1) {
    DVar5 = DecodeDPRRegisterClass
                      ((MCInst *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),RegNo,in_RCX,
                       (void *)CONCAT44(local_4,uVar4));
    _Var1 = Check((DecodeStatus *)&stack0xffffffffffffffd4,DVar5);
    if (_Var1) {
      MCOperand_CreateImm0(in_RDI,(long)(8 << ((byte)uVar2 & 0x1f)));
    }
    else {
      local_4 = MCDisassembler_Fail;
    }
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeVSHLMaxInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Rm, size;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	Rm = fieldFromInstruction_4(Insn, 0, 4);
	Rm |= fieldFromInstruction_4(Insn, 5, 1) << 4;
	size = fieldFromInstruction_4(Insn, 18, 2);

	if (!Check(&S, DecodeQPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, 8 << size);

	return S;
}